

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  void **arr;
  byte bVar2;
  void *__dest;
  long lVar3;
  long lVar4;
  bool bVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int itemsize;
  int iVar13;
  int iVar14;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar15;
  undefined8 extraout_RDX_00;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  uint uVar19;
  ulong uVar20;
  int res_3;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int local_90;
  uint local_8c;
  uchar *local_88;
  void *local_80;
  ulong local_78;
  uchar *local_70;
  int local_68;
  int local_64;
  int *local_60;
  ulong local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  long local_38;
  
  uVar20 = (ulong)(uint)data_len;
  local_8c = 0;
  local_90 = 0;
  local_88 = (uchar *)0x0;
  local_80 = malloc(0x20000);
  if (local_80 == (void *)0x0) {
    return (uchar *)0x0;
  }
  local_58 = 5;
  if (5 < quality) {
    local_58 = (ulong)(uint)quality;
  }
  local_60 = out_len;
  stbiw__sbgrowf(&local_88,1,itemsize);
  iVar14 = *(int *)(local_88 + -4);
  iVar13 = iVar14 + 1;
  *(int *)(local_88 + -4) = iVar13;
  local_88[iVar14] = 'x';
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar13);
  }
  iVar14 = *(int *)(local_88 + -4);
  *(int *)(local_88 + -4) = iVar14 + 1;
  local_88[iVar14] = '^';
  local_8c = 1;
  local_90 = 1;
  local_88 = stbiw__zlib_flushf(local_88,&local_8c,&local_90);
  local_8c = local_8c | 1 << ((byte)local_90 & 0x1f);
  local_90 = local_90 + 2;
  local_88 = stbiw__zlib_flushf(local_88,&local_8c,&local_90);
  pvVar18 = local_80;
  uVar7 = 0;
  local_70 = local_88;
  memset(local_80,0,0x20000);
  local_78 = uVar20;
  if (3 < data_len) {
    local_64 = data_len + -3;
    local_68 = (int)local_58 * 2;
    local_40 = local_58 & 0xffffffff;
    local_48 = local_40 * 8;
    uVar21 = 0;
    do {
      iVar14 = (int)uVar21;
      local_38 = (long)iVar14;
      uVar7 = (uint)CONCAT12(data[local_38 + 2],*(undefined2 *)(data + local_38)) * 8 ^
              (uint)CONCAT12(data[local_38 + 2],*(undefined2 *)(data + local_38));
      uVar7 = (uVar7 >> 5) + uVar7;
      uVar7 = uVar7 * 0x10 ^ uVar7;
      uVar7 = (uVar7 >> 0x11) + uVar7;
      uVar24 = (ulong)((uVar7 >> 6) + uVar7 & 0x3fff);
      __dest = *(void **)((long)pvVar18 + uVar24 * 8);
      uVar7 = 0;
      if (__dest != (void *)0x0) {
        uVar7 = *(uint *)((long)__dest + -4);
      }
      pbVar1 = data + local_38;
      if ((int)uVar7 < 1) {
        iVar13 = 3;
        lVar25 = 0;
      }
      else {
        iVar11 = iVar14 + -0x8000;
        iVar14 = (int)uVar20 - iVar14;
        uVar19 = iVar14 - 1;
        if (0x100 < uVar19) {
          uVar19 = 0x101;
        }
        iVar13 = 3;
        uVar20 = 0;
        lVar25 = 0;
        do {
          lVar3 = *(long *)((long)__dest + uVar20 * 8);
          if ((long)iVar11 < lVar3 - (long)data) {
            uVar23 = 0;
            if (0 < iVar14) {
              do {
                if (*(byte *)(lVar3 + uVar23) != pbVar1[uVar23]) goto LAB_001ae7ff;
                uVar23 = uVar23 + 1;
              } while (uVar19 + 1 != uVar23);
              uVar23 = (ulong)(uVar19 + 1);
            }
LAB_001ae7ff:
            iVar22 = (int)uVar23;
            iVar12 = iVar13;
            if (iVar13 < iVar22) {
              iVar12 = iVar22;
            }
            bVar5 = iVar13 <= iVar22;
            iVar13 = iVar12;
            if (bVar5) {
              lVar25 = lVar3;
            }
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar7);
      }
      arr = (void **)((long)pvVar18 + uVar24 * 8);
      local_50 = uVar21;
      if (__dest == (void *)0x0) {
LAB_001ae85d:
        stbiw__sbgrowf(arr,8,iVar14);
      }
      else {
        if (*(int *)((long)__dest + -4) == local_68) {
          memmove(__dest,(void *)((long)__dest + local_40 * 8),local_48);
          *(int *)((long)__dest + -4) = (int)local_58;
          iVar14 = extraout_EDX;
        }
        if ((__dest == (void *)0x0) ||
           (*(int *)((long)__dest + -8) <= *(int *)((long)__dest + -4) + 1)) goto LAB_001ae85d;
      }
      pvVar18 = *arr;
      iVar14 = *(int *)((long)pvVar18 + -4);
      *(int *)((long)pvVar18 + -4) = iVar14 + 1;
      *(byte **)((long)pvVar18 + (long)iVar14 * 8) = pbVar1;
      if (lVar25 == 0) {
        lVar25 = 0;
      }
      else {
        uVar7 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar7 = (uVar7 >> 5) + uVar7;
        uVar7 = uVar7 * 0x10 ^ uVar7;
        uVar7 = (uVar7 >> 0x11) + uVar7;
        lVar3 = *(long *)((long)local_80 + (ulong)((uVar7 >> 6) + uVar7 & 0x3fff) * 8);
        if (lVar3 == 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = (ulong)*(uint *)(lVar3 + -4);
        }
        if (0 < (int)uVar20) {
          uVar19 = ~(uint)local_50;
          uVar7 = (uVar19 + (int)local_78) - 1;
          if (0x100 < uVar7) {
            uVar7 = 0x101;
          }
          uVar21 = 0;
          do {
            lVar4 = *(long *)(lVar3 + uVar21 * 8);
            if ((long)(int)((uint)local_50 - 0x7fff) < lVar4 - (long)data) {
              uVar24 = 0;
              if (0 < (int)(uVar19 + (int)local_78)) {
                do {
                  if (*(uchar *)(lVar4 + uVar24) != data[uVar24 + local_38 + 1]) goto LAB_001ae951;
                  uVar24 = uVar24 + 1;
                } while (uVar7 + 1 != uVar24);
                uVar24 = (ulong)(uVar7 + 1);
              }
LAB_001ae951:
              if (iVar13 < (int)uVar24) {
                lVar25 = 0;
                break;
              }
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar20);
        }
      }
      bVar10 = (byte)local_90;
      if (lVar25 == 0) {
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar7 = bVar2 + 0x30;
          iVar13 = 0;
          iVar14 = -8;
          do {
            iVar13 = (uVar7 & 1) + iVar13 * 2;
            uVar7 = uVar7 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar7 = iVar13 << (bVar10 & 0x1f);
          local_90 = local_90 + 8;
        }
        else {
          uVar7 = bVar2 | 0x100;
          iVar13 = 0;
          iVar14 = -9;
          do {
            iVar13 = (uVar7 & 1) + iVar13 * 2;
            uVar7 = uVar7 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar7 = iVar13 << (bVar10 & 0x1f);
          local_90 = local_90 + 9;
        }
        local_8c = local_8c | uVar7;
        iVar13 = 1;
        pvVar18 = local_80;
        puVar9 = local_70;
        uVar20 = local_78;
LAB_001aeb7c:
        puVar9 = stbiw__zlib_flushf(puVar9,&local_8c,&local_90);
      }
      else {
        iVar14 = (int)pbVar1 - (int)lVar25;
        uVar20 = 0;
        do {
          uVar21 = uVar20;
          uVar20 = uVar21 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar21 + 1] <= iVar13);
        if (uVar21 < 0x17) {
          iVar11 = 0;
          iVar12 = -7;
          do {
            iVar11 = ((uint)uVar20 & 1) + iVar11 * 2;
            uVar20 = (ulong)((uint)uVar20 >> 1);
            iVar12 = iVar12 + 1;
          } while (iVar12 != 0);
          uVar7 = iVar11 << (bVar10 & 0x1f);
          local_90 = local_90 + 7;
        }
        else {
          uVar7 = (int)uVar20 + 0xa8;
          iVar11 = 0;
          iVar12 = -8;
          do {
            iVar11 = (uVar7 & 1) + iVar11 * 2;
            uVar7 = uVar7 >> 1;
            iVar12 = iVar12 + 1;
          } while (iVar12 != 0);
          uVar7 = iVar11 << (bVar10 & 0x1f);
          local_90 = local_90 + 8;
        }
        local_8c = local_8c | uVar7;
        puVar9 = stbiw__zlib_flushf(local_70,&local_8c,&local_90);
        uVar21 = uVar21 & 0xffffffff;
        if (0xffffffffffffffeb < uVar21 - 0x1c) {
          local_8c = local_8c |
                     iVar13 - (uint)stbi_zlib_compress::lengthc[uVar21] << ((byte)local_90 & 0x1f);
          local_90 = (uint)""[uVar21] + local_90;
          puVar9 = stbiw__zlib_flushf(puVar9,&local_8c,&local_90);
        }
        uVar20 = local_78;
        pvVar18 = local_80;
        uVar21 = 0xffffffffffffffff;
        do {
          lVar25 = uVar21 + 2;
          uVar21 = uVar21 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar25] <= iVar14);
        iVar11 = 0;
        iVar12 = -5;
        uVar24 = uVar21 & 0xffffffff;
        do {
          iVar11 = ((uint)uVar24 & 1) + iVar11 * 2;
          uVar24 = uVar24 >> 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
        local_8c = local_8c | iVar11 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 5;
        puVar9 = stbiw__zlib_flushf(puVar9,&local_8c,&local_90);
        if (3 < uVar21) {
          local_8c = local_8c |
                     iVar14 - (uint)stbi_zlib_compress::distc[uVar21 & 0xffffffff] <<
                     ((byte)local_90 & 0x1f);
          local_90 = (uint)""[uVar21 & 0xffffffff] + local_90;
          goto LAB_001aeb7c;
        }
      }
      uVar7 = iVar13 + (int)local_50;
      uVar21 = (ulong)uVar7;
      local_70 = puVar9;
    } while ((int)uVar7 < local_64);
  }
  local_88 = local_70;
  uVar19 = (uint)uVar20;
  puVar9 = local_70;
  if ((int)uVar7 < (int)uVar19) {
    lVar25 = (long)(int)uVar7;
    do {
      bVar10 = data[lVar25];
      if (bVar10 < 0x90) {
        uVar7 = bVar10 + 0x30;
        iVar14 = 0;
        iVar13 = -8;
        do {
          iVar14 = (uVar7 & 1) + iVar14 * 2;
          uVar7 = uVar7 >> 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 0);
        uVar7 = iVar14 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 8;
      }
      else {
        uVar7 = bVar10 | 0x100;
        iVar14 = 0;
        iVar13 = -9;
        do {
          iVar14 = (uVar7 & 1) + iVar14 * 2;
          uVar7 = uVar7 >> 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 0);
        uVar7 = iVar14 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 9;
      }
      local_8c = local_8c | uVar7;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_8c,&local_90);
      lVar25 = lVar25 + 1;
    } while ((uint)lVar25 != uVar19);
  }
  local_90 = local_90 + 7;
  local_88 = puVar9;
  puVar9 = stbiw__zlib_flushf(puVar9,&local_8c,&local_90);
  if (local_90 != 0) {
    do {
      local_90 = local_90 + 1;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_8c,&local_90);
    } while (local_90 != 0);
  }
  pvVar18 = local_80;
  lVar25 = 0;
  local_88 = puVar9;
  do {
    lVar3 = *(long *)((long)pvVar18 + lVar25 * 8);
    if (lVar3 != 0) {
      free((void *)(lVar3 + -8));
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x4000);
  free(pvVar18);
  uVar7 = (uint)extraout_RDX;
  iVar14 = (int)((ulong)((long)(int)(uVar19 + 0x7ffe) * -0x7ffefffd) >> 0x20) + uVar19 + 0x7ffe;
  if (((int)(((iVar14 >> 0xe) - (iVar14 >> 0x1f)) * 5 + uVar19 + 2) < *(int *)(puVar9 + -4)) &&
     (puVar9[-4] = '\x02', puVar9[-3] = '\0', puVar9[-2] = '\0', puVar9[-1] = '\0', 0 < (int)uVar19)
     ) {
    iVar14 = 0;
    uVar15 = extraout_RDX;
    do {
      uVar7 = (int)uVar20 - iVar14;
      uVar19 = 0x7fff;
      if ((int)uVar7 < 0x7fff) {
        uVar19 = uVar7;
      }
      if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
        stbiw__sbgrowf(&local_88,1,(int)uVar15);
      }
      iVar13 = *(int *)(local_88 + -4);
      iVar11 = iVar13 + 1;
      *(int *)(local_88 + -4) = iVar11;
      local_88[iVar13] = (int)uVar7 < 0x8000;
      if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
        stbiw__sbgrowf(&local_88,1,iVar11);
      }
      iVar13 = *(int *)(local_88 + -4);
      iVar11 = iVar13 + 1;
      *(int *)(local_88 + -4) = iVar11;
      local_88[iVar13] = (uchar)uVar19;
      if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
        stbiw__sbgrowf(&local_88,1,iVar11);
      }
      iVar13 = *(int *)(local_88 + -4);
      iVar11 = iVar13 + 1;
      *(int *)(local_88 + -4) = iVar11;
      local_88[iVar13] = (uchar)(uVar19 >> 8);
      if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
        stbiw__sbgrowf(&local_88,1,iVar11);
      }
      iVar13 = *(int *)(local_88 + -4);
      iVar11 = iVar13 + 1;
      *(int *)(local_88 + -4) = iVar11;
      local_88[iVar13] = (uchar)~uVar19;
      if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
        stbiw__sbgrowf(&local_88,1,iVar11);
      }
      puVar9 = local_88;
      iVar13 = *(int *)(local_88 + -4);
      *(int *)(local_88 + -4) = iVar13 + 1;
      local_88[iVar13] = (uchar)(~uVar19 >> 8);
      memcpy(local_88 + *(int *)(local_88 + -4),data + iVar14,(long)(int)uVar19);
      uVar7 = (uint)extraout_RDX_00;
      *(uint *)(puVar9 + -4) = *(int *)(puVar9 + -4) + uVar19;
      iVar14 = iVar14 + uVar19;
      uVar19 = (uint)local_78;
      uVar15 = extraout_RDX_00;
      uVar20 = local_78;
    } while (iVar14 < (int)uVar19);
  }
  piVar6 = local_60;
  if ((int)uVar19 < 1) {
    uVar16 = 0;
    uVar17 = 1;
  }
  else {
    uVar8 = uVar19 % 0x15b0;
    uVar17 = 1;
    uVar16 = 0;
    uVar20 = 0;
    do {
      if (uVar8 != 0) {
        uVar21 = 0;
        do {
          uVar17 = uVar17 + data[uVar21 + uVar20];
          uVar16 = uVar16 + uVar17;
          uVar21 = uVar21 + 1;
        } while (uVar8 != uVar21);
        uVar17 = uVar17 % 0xfff1;
        uVar16 = uVar16 % 0xfff1;
      }
      uVar7 = (int)uVar20 + uVar8;
      uVar20 = (ulong)uVar7;
      uVar8 = 0x15b0;
    } while ((int)uVar7 < (int)uVar19);
  }
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,uVar7);
  }
  iVar14 = *(int *)(local_88 + -4);
  iVar13 = iVar14 + 1;
  *(int *)(local_88 + -4) = iVar13;
  local_88[iVar14] = (uchar)(uVar16 >> 8);
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar13);
  }
  iVar14 = *(int *)(local_88 + -4);
  iVar13 = iVar14 + 1;
  *(int *)(local_88 + -4) = iVar13;
  local_88[iVar14] = (uchar)uVar16;
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar13);
  }
  iVar14 = *(int *)(local_88 + -4);
  iVar13 = iVar14 + 1;
  *(int *)(local_88 + -4) = iVar13;
  local_88[iVar14] = (uchar)(uVar17 >> 8);
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar13);
  }
  iVar14 = *(int *)(local_88 + -4);
  *(int *)(local_88 + -4) = iVar14 + 1;
  local_88[iVar14] = (uchar)uVar17;
  iVar14 = *(int *)(local_88 + -4);
  *piVar6 = iVar14;
  puVar9 = (uchar *)memmove(local_88 + -8,local_88,(long)iVar14);
  return puVar9;
}

Assistant:

STBIWDEF unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
#ifdef STBIW_ZLIB_COMPRESS
   // user provided a zlib compress implementation, use that
   return STBIW_ZLIB_COMPRESS(data, data_len, out_len, quality);
#else // use builtin
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(unsigned char**));
   if (hash_table == NULL)
      return NULL;
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) { best=d; bestloc=hlist[j]; }
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   // store uncompressed instead if compression was worse
   if (stbiw__sbn(out) > data_len + 2 + ((data_len+32766)/32767)*5) {
      stbiw__sbn(out) = 2;  // truncate to DEFLATE 32K window and FLEVEL = 1
      for (j = 0; j < data_len;) {
         int blocklen = data_len - j;
         if (blocklen > 32767) blocklen = 32767;
         stbiw__sbpush(out, data_len - j == blocklen); // BFINAL = ?, BTYPE = 0 -- no compression
         stbiw__sbpush(out, STBIW_UCHAR(blocklen)); // LEN
         stbiw__sbpush(out, STBIW_UCHAR(blocklen >> 8));
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen)); // NLEN
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen >> 8));
         memcpy(out+stbiw__sbn(out), data+j, blocklen);
         stbiw__sbn(out) += blocklen;
         j += blocklen;
      }
   }

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) { s1 += data[j+i]; s2 += s1; }
         s1 %= 65521; s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
#endif // STBIW_ZLIB_COMPRESS
}